

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

_Bool array_array_container_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  array_container_t *paVar4;
  bitset_container_t *pbVar5;
  uint64_t uVar6;
  array_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  _Bool local_1;
  
  iVar3 = *in_RDI + *in_RSI;
  if (iVar3 < 0x1001) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
    *(array_container_t **)in_RDX = paVar4;
    lVar1._0_4_ = in_RDX->cardinality;
    lVar1._4_4_ = in_RDX->capacity;
    if (lVar1 == 0) {
      local_1 = true;
    }
    else {
      array_container_union
                (in_RDX,(array_container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd0);
      local_1 = false;
    }
  }
  else {
    pbVar5 = bitset_container_create();
    *(bitset_container_t **)in_RDX = pbVar5;
    uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
    lVar2._0_4_ = in_RDX->cardinality;
    lVar2._4_4_ = in_RDX->capacity;
    if (lVar2 != 0) {
      pbVar5 = *(bitset_container_t **)in_RDX;
      bitset_set_list((uint64_t *)pbVar5,
                      (uint16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      0x18c6fb);
      uVar6 = bitset_set_list_withcard
                        ((uint64_t *)CONCAT44(iVar3,uVar7),(uint64_t)pbVar5,
                         (uint16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         0x18c722);
      pbVar5->cardinality = (int32_t)uVar6;
      if (pbVar5->cardinality < 0x1001) {
        paVar4 = array_container_from_bitset(pbVar5);
        *(array_container_t **)in_RDX = paVar4;
        bitset_container_free((bitset_container_t *)0x18c757);
        uVar7 = 0;
      }
    }
    local_1 = (_Bool)((byte)((uint)uVar7 >> 0x18) & 1);
  }
  return local_1;
}

Assistant:

bool array_array_container_union(const array_container_t *src_1,
                                 const array_container_t *src_2,
                                 container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL) {
            array_container_union(src_1, src_2, CAST_array(*dst));
        } else {
            return true;  // otherwise failure won't be caught
        }
        return false;  // not a bitset
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            *dst = array_container_from_bitset(ourbitset);
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}